

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

void build_sorted_tables(ecs_query_t *query)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int start;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  
  ecs_vector_free(query->table_slices);
  query->table_slices = (ecs_vector_t *)0x0;
  uVar1 = ecs_vector_count(query->tables);
  pvVar3 = _ecs_vector_first(query->tables,0x50,0x10);
  if ((int)uVar1 < 1) {
    uVar5 = 0;
    start = 0;
  }
  else {
    piVar6 = (int *)((long)pvVar3 + 0x48);
    uVar5 = 0;
    iVar2 = 0;
    uVar4 = 0;
    do {
      if (iVar2 != *piVar6) {
        if (uVar5 != uVar4) {
          build_sorted_table_range(query,(int32_t)uVar4,(int32_t)uVar5);
          uVar4 = uVar5 & 0xffffffff;
        }
        iVar2 = *piVar6;
      }
      start = (int)uVar4;
      uVar5 = uVar5 + 1;
      piVar6 = piVar6 + 0x14;
    } while (uVar1 != uVar5);
  }
  if (start != (int)uVar5) {
    build_sorted_table_range(query,start,(int)uVar5);
    return;
  }
  return;
}

Assistant:

static
void build_sorted_tables(
    ecs_query_t *query)
{
    /* Clean previous sorted tables */
    ecs_vector_free(query->table_slices);
    query->table_slices = NULL;

    int32_t i, count = ecs_vector_count(query->tables);
    ecs_matched_table_t *tables = ecs_vector_first(query->tables, ecs_matched_table_t);
    ecs_matched_table_t *table = NULL;

    int32_t start = 0, rank = 0;
    for (i = 0; i < count; i ++) {
        table = &tables[i];
        if (rank != table->rank) {
            if (start != i) {
                build_sorted_table_range(query, start, i);
                start = i;
            }
            rank = table->rank;
        }
    }

    if (start != i) {
        build_sorted_table_range(query, start, i);
    }
}